

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

Status * __thiscall
draco::ObjDecoder::DecodeFromBuffer(ObjDecoder *this,DecoderBuffer *buffer,Mesh *out_mesh)

{
  undefined8 in_RCX;
  long in_RSI;
  PointCloud *in_RDI;
  DecoderBuffer *unaff_retaddr;
  
  *(undefined8 *)(in_RSI + 0x138) = in_RCX;
  DecodeFromBuffer((ObjDecoder *)out_mesh,unaff_retaddr,in_RDI);
  return (Status *)in_RDI;
}

Assistant:

Status ObjDecoder::DecodeFromBuffer(DecoderBuffer *buffer, Mesh *out_mesh) {
  out_mesh_ = out_mesh;
  return DecodeFromBuffer(buffer, static_cast<PointCloud *>(out_mesh));
}